

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O1

void TranslateFunctionDefinition(ExpressionTranslateContext *ctx,ExprFunctionDefinition *expression)

{
  long *plVar1;
  uint uVar2;
  FunctionData *function;
  VariableData *variable;
  TypeBase *pTVar3;
  ExprBase *expression_00;
  bool bVar4;
  ScopeData *pSVar5;
  ExprVariableDefinition *pEVar6;
  TypeBase *pTVar7;
  long lVar8;
  long lVar9;
  byte bVar10;
  uint uVar11;
  ulong uVar12;
  char *format;
  
  if (ctx->skipFunctionDefinitions != false) {
    Print(ctx,"(");
    TranslateTypeName(ctx,(expression->super_ExprBase).type);
    Print(ctx,")");
    Print(ctx,"__nullcMakeFunction(__nullcFR[%d], 0)",(ulong)expression->function->functionIndex);
    return;
  }
  ctx->skipFunctionDefinitions = true;
  function = expression->function;
  pSVar5 = function->scope;
  if ((((pSVar5 == ctx->ctx->globalScope) || (pSVar5->ownerNamespace != (NamespaceData *)0x0)) ||
      (pSVar5->ownerType != (TypeBase *)0x0)) &&
     ((*(function->name->name).begin != '$' && (function->isHidden == false)))) {
    bVar4 = ExpressionContext::IsGenericInstance(ctx->ctx,function);
    bVar10 = 0;
  }
  else {
    bVar10 = 1;
    bVar4 = false;
  }
  if ((bVar10 | bVar4) == 1) {
    format = "template<int I> ";
    if (bVar10 != 0) {
      format = "static ";
    }
    Print(ctx,format);
  }
  TranslateTypeName(ctx,function->type->returnType);
  Print(ctx," ");
  TranslateFunctionName(ctx,function);
  Print(ctx,"(");
  pEVar6 = (expression->arguments).head;
  while (pEVar6 != (ExprVariableDefinition *)0x0) {
    TranslateTypeName(ctx,pEVar6->variable->variable->type);
    Print(ctx," ");
    TranslateVariableName(ctx,pEVar6->variable->variable);
    Print(ctx,", ");
    pEVar6 = (ExprVariableDefinition *)(pEVar6->super_ExprBase).next;
    if ((pEVar6 == (ExprVariableDefinition *)0x0) || ((pEVar6->super_ExprBase).typeID != 0x1e)) {
      pEVar6 = (ExprVariableDefinition *)0x0;
    }
  }
  TranslateTypeName(ctx,expression->contextArgument->variable->variable->type);
  Print(ctx," ");
  TranslateVariableName(ctx,expression->contextArgument->variable->variable);
  Print(ctx,")");
  OutputContext::Print(ctx->output,"\n",1);
  PrintIndentedLine(ctx,"{");
  ctx->depth = ctx->depth + 1;
  pSVar5 = function->functionScope;
  if ((pSVar5->allVariables).count != 0) {
    uVar12 = 0;
    do {
      variable = (pSVar5->allVariables).data[uVar12];
      if ((variable->isVmAlloca == false) && (variable->lookupOnly == false)) {
        pEVar6 = (expression->arguments).head;
        while (pEVar6 != (ExprVariableDefinition *)0x0) {
          if (variable == pEVar6->variable->variable) goto LAB_00145f87;
          pEVar6 = (ExprVariableDefinition *)(pEVar6->super_ExprBase).next;
          if ((pEVar6 == (ExprVariableDefinition *)0x0) || ((pEVar6->super_ExprBase).typeID != 0x1e)
             ) {
            pEVar6 = (ExprVariableDefinition *)0x0;
          }
        }
        if ((variable != expression->contextArgument->variable->variable) &&
           (variable->type != ctx->ctx->typeVoid)) {
          PrintIndent(ctx);
          pTVar3 = variable->type;
          if ((pTVar3 == (TypeBase *)0x0) || (pTVar7 = pTVar3, pTVar3->typeID != 0x18)) {
            pTVar7 = (TypeBase *)0x0;
          }
          if (pTVar7 == (TypeBase *)0x0) {
            if (pTVar3->alignment != variable->alignment) goto LAB_00145ed9;
          }
          else {
            lVar8._0_4_ = pTVar7[1].typeID;
            lVar8._4_4_ = pTVar7[1].nameHash;
            uVar11 = 0;
            while (lVar8 != 0) {
              plVar1 = (long *)(lVar8 + 8);
              lVar8 = *(long *)(lVar8 + 0x18);
              uVar2 = *(uint *)(*plVar1 + 0x18);
              if (uVar11 <= uVar2) {
                uVar11 = uVar2;
              }
            }
            if (uVar11 != variable->alignment) {
LAB_00145ed9:
              Print(ctx,"NULLC_ALIGN_MSVC(%d) ");
            }
          }
          TranslateTypeName(ctx,variable->type);
          pTVar3 = variable->type;
          if ((pTVar3 == (TypeBase *)0x0) || (pTVar7 = pTVar3, pTVar3->typeID != 0x18)) {
            pTVar7 = (TypeBase *)0x0;
          }
          if (pTVar7 == (TypeBase *)0x0) {
            if (pTVar3->alignment != variable->alignment) goto LAB_00145f38;
          }
          else {
            lVar9._0_4_ = pTVar7[1].typeID;
            lVar9._4_4_ = pTVar7[1].nameHash;
            uVar11 = 0;
            while (lVar9 != 0) {
              plVar1 = (long *)(lVar9 + 8);
              lVar9 = *(long *)(lVar9 + 0x18);
              uVar2 = *(uint *)(*plVar1 + 0x18);
              if (uVar11 <= uVar2) {
                uVar11 = uVar2;
              }
            }
            if (uVar11 != variable->alignment) {
LAB_00145f38:
              Print(ctx," NULLC_ALIGN_GCC(%d)");
            }
          }
          Print(ctx," ");
          TranslateVariableName(ctx,variable);
          Print(ctx,";");
          OutputContext::Print(ctx->output,"\n",1);
        }
      }
LAB_00145f87:
      uVar12 = uVar12 + 1;
      pSVar5 = function->functionScope;
    } while (uVar12 < (pSVar5->allVariables).count);
  }
  if (function->type->returnType != ctx->ctx->typeVoid) {
    PrintIndent(ctx);
    TranslateTypeName(ctx,function->type->returnType);
    Print(ctx," __nullcReturnValue_%d;",(ulong)ctx->nextReturnValueId);
    OutputContext::Print(ctx->output,"\n",1);
  }
  if (expression->coroutineStateRead != (ExprBase *)0x0) {
    PrintIndent(ctx);
    Print(ctx,"int __currJmpOffset = ");
    Translate(ctx,expression->coroutineStateRead);
    Print(ctx,";");
    OutputContext::Print(ctx->output,"\n",1);
    if (function->yieldCount != 0) {
      uVar11 = 0;
      do {
        uVar11 = uVar11 + 1;
        PrintIndentedLine(ctx,"if(__currJmpOffset == %d)",(ulong)uVar11);
        ctx->depth = ctx->depth + 1;
        PrintIndentedLine(ctx,"goto yield_%d;",(ulong)uVar11);
        ctx->depth = ctx->depth - 1;
      } while (uVar11 < function->yieldCount);
    }
  }
  for (expression_00 = (expression->expressions).head; expression_00 != (ExprBase *)0x0;
      expression_00 = expression_00->next) {
    PrintIndent(ctx);
    Translate(ctx,expression_00);
    Print(ctx,";");
    OutputContext::Print(ctx->output,"\n",1);
  }
  ctx->depth = ctx->depth - 1;
  PrintIndentedLine(ctx,"}");
  ctx->nextReturnValueId = ctx->nextReturnValueId + 1;
  if (bVar4 != false) {
    Print(ctx,"template ");
    TranslateTypeName(ctx,function->type->returnType);
    Print(ctx," ");
    TranslateFunctionName(ctx,function);
    Print(ctx,"<0>(");
    pEVar6 = (expression->arguments).head;
    while (pEVar6 != (ExprVariableDefinition *)0x0) {
      TranslateTypeName(ctx,pEVar6->variable->variable->type);
      Print(ctx," ");
      TranslateVariableName(ctx,pEVar6->variable->variable);
      Print(ctx,", ");
      pEVar6 = (ExprVariableDefinition *)(pEVar6->super_ExprBase).next;
      if ((pEVar6 == (ExprVariableDefinition *)0x0) || ((pEVar6->super_ExprBase).typeID != 0x1e)) {
        pEVar6 = (ExprVariableDefinition *)0x0;
      }
    }
    TranslateTypeName(ctx,expression->contextArgument->variable->variable->type);
    Print(ctx," ");
    TranslateVariableName(ctx,expression->contextArgument->variable->variable);
    Print(ctx,");");
    OutputContext::Print(ctx->output,"\n",1);
  }
  ctx->skipFunctionDefinitions = false;
  return;
}

Assistant:

void TranslateFunctionDefinition(ExpressionTranslateContext &ctx, ExprFunctionDefinition *expression)
{
	if(!ctx.skipFunctionDefinitions)
	{
		// Skip nested definitions
		ctx.skipFunctionDefinitions = true;

		FunctionData *function = expression->function;

		bool isStatic = false;
		bool isGeneric = false;

		if(function->scope != ctx.ctx.globalScope && !function->scope->ownerNamespace && !function->scope->ownerType)
			isStatic = true;
		else if(*function->name->name.begin == '$')
			isStatic = true;
		else if(function->isHidden)
			isStatic = true;
		else if(ctx.ctx.IsGenericInstance(function))
			isGeneric = true;

		if(isStatic)
			Print(ctx, "static ");
		else if(isGeneric)
			Print(ctx, "template<int I> ");

		TranslateTypeName(ctx, function->type->returnType);
		Print(ctx, " ");
		TranslateFunctionName(ctx, function);
		Print(ctx, "(");

		for(ExprVariableDefinition *curr = expression->arguments.head; curr; curr = getType<ExprVariableDefinition>(curr->next))
		{
			TranslateTypeName(ctx, curr->variable->variable->type);
			Print(ctx, " ");
			TranslateVariableName(ctx, curr->variable->variable);
			Print(ctx, ", ");
		}

		TranslateTypeName(ctx, expression->contextArgument->variable->variable->type);
		Print(ctx, " ");
		TranslateVariableName(ctx, expression->contextArgument->variable->variable);

		Print(ctx, ")");
		PrintLine(ctx);
		PrintIndentedLine(ctx, "{");
		ctx.depth++;

		for(unsigned k = 0; k < function->functionScope->allVariables.size(); k++)
		{
			VariableData *variable = function->functionScope->allVariables[k];

			// Don't need variables allocated by intermediate vm compilation
			if(variable->isVmAlloca)
				continue;

			if(variable->lookupOnly)
				continue;

			bool isArgument = false;

			for(ExprVariableDefinition *curr = expression->arguments.head; curr; curr = getType<ExprVariableDefinition>(curr->next))
			{
				if(variable == curr->variable->variable)
				{
					isArgument = true;
					break;
				}
			}

			if(isArgument || variable == expression->contextArgument->variable->variable)
				continue;

			if(variable->type == ctx.ctx.typeVoid)
				continue;

			PrintIndent(ctx);

			if(TypeClass *typeClass = getType<TypeClass>(variable->type))
			{
				if(GetNaturalClassAlignment(typeClass) != variable->alignment)
					Print(ctx, "NULLC_ALIGN_MSVC(%d) ", variable->alignment);
			}
			else if(variable->type->alignment != variable->alignment)
			{
				Print(ctx, "NULLC_ALIGN_MSVC(%d) ", variable->alignment);
			}

			TranslateTypeName(ctx, variable->type);

			if(TypeClass *typeClass = getType<TypeClass>(variable->type))
			{
				if(GetNaturalClassAlignment(typeClass) != variable->alignment)
					Print(ctx, " NULLC_ALIGN_GCC(%d)", variable->alignment);
			}
			else if(variable->type->alignment != variable->alignment)
			{
				Print(ctx, " NULLC_ALIGN_GCC(%d)", variable->alignment);
			}

			Print(ctx, " ");
			TranslateVariableName(ctx, variable);
			Print(ctx, ";");
			PrintLine(ctx);
		}

		if(function->type->returnType != ctx.ctx.typeVoid)
		{
			PrintIndent(ctx);
			TranslateTypeName(ctx, function->type->returnType);
			Print(ctx, " __nullcReturnValue_%d;", ctx.nextReturnValueId);
			PrintLine(ctx);
		}

		if(expression->coroutineStateRead)
		{
			PrintIndent(ctx);
			Print(ctx, "int __currJmpOffset = ");
			Translate(ctx, expression->coroutineStateRead);
			Print(ctx, ";");
			PrintLine(ctx);

			for(unsigned i = 0; i < function->yieldCount; i++)
			{
				PrintIndentedLine(ctx, "if(__currJmpOffset == %d)", i + 1);

				ctx.depth++;

				PrintIndentedLine(ctx, "goto yield_%d;", i + 1);

				ctx.depth--;
			}
		}

		for(ExprBase *value = expression->expressions.head; value; value = value->next)
		{
			PrintIndent(ctx);

			Translate(ctx, value);

			Print(ctx, ";");

			PrintLine(ctx);
		}


		ctx.depth--;

		PrintIndentedLine(ctx, "}");

		ctx.nextReturnValueId++;

		if(isGeneric)
		{
			Print(ctx, "template ");

			TranslateTypeName(ctx, function->type->returnType);
			Print(ctx, " ");
			TranslateFunctionName(ctx, function);
			Print(ctx, "<0>(");

			for(ExprVariableDefinition *curr = expression->arguments.head; curr; curr = getType<ExprVariableDefinition>(curr->next))
			{
				TranslateTypeName(ctx, curr->variable->variable->type);
				Print(ctx, " ");
				TranslateVariableName(ctx, curr->variable->variable);
				Print(ctx, ", ");
			}

			TranslateTypeName(ctx, expression->contextArgument->variable->variable->type);
			Print(ctx, " ");
			TranslateVariableName(ctx, expression->contextArgument->variable->variable);

			Print(ctx, ");");
			PrintLine(ctx);
		}

		ctx.skipFunctionDefinitions = false;
	}
	else
	{
		Print(ctx, "(");
		TranslateTypeName(ctx, expression->type);
		Print(ctx, ")");
		Print(ctx, "__nullcMakeFunction(__nullcFR[%d], 0)", expression->function->functionIndex);
	}
}